

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
emplaceRealloc<std::basic_string_view<char,std::char_traits<char>>>
          (SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *this,pointer pos,
          basic_string_view<char,_std::char_traits<char>_> *args)

{
  ulong uVar1;
  pointer p;
  char *pcVar2;
  size_t *psVar3;
  size_t *psVar4;
  pointer pbVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  if (*(long *)(this + 8) == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar9 = *(long *)(this + 8) + 1;
  uVar1 = *(ulong *)(this + 0x10);
  if (uVar9 < uVar1 * 2) {
    uVar9 = uVar1 * 2;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    uVar9 = 0x7ffffffffffffff;
  }
  lVar7 = (long)pos - *(long *)this;
  psVar3 = (size_t *)operator_new(uVar9 << 4);
  pcVar2 = args->_M_str;
  *(size_t *)((long)psVar3 + lVar7) = args->_M_len;
  ((size_t *)((long)psVar3 + lVar7))[1] = (size_t)pcVar2;
  p = *(pointer *)this;
  lVar8 = *(long *)(this + 8);
  lVar6 = (long)p + (lVar8 * 0x10 - (long)pos);
  pbVar5 = p;
  psVar4 = psVar3;
  if (lVar6 == 0) {
    if (lVar8 != 0) {
      do {
        pcVar2 = pbVar5->_M_str;
        *psVar4 = pbVar5->_M_len;
        psVar4[1] = (size_t)pcVar2;
        pbVar5 = pbVar5 + 1;
        psVar4 = psVar4 + 2;
      } while (pbVar5 != pos);
    }
  }
  else {
    for (; pbVar5 != pos; pbVar5 = pbVar5 + 1) {
      pcVar2 = pbVar5->_M_str;
      *psVar4 = pbVar5->_M_len;
      psVar4[1] = (size_t)pcVar2;
      psVar4 = psVar4 + 2;
    }
    memcpy((void *)((long)psVar3 + lVar7 + 0x10),pos,(lVar6 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)(this + 0x18)) {
    operator_delete(p);
    lVar8 = *(long *)(this + 8);
  }
  *(long *)(this + 8) = lVar8 + 1;
  *(ulong *)(this + 0x10) = uVar9;
  *(size_t **)this = psVar3;
  return (pointer)((long)psVar3 + lVar7);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}